

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O1

int do_EC_KEY_print(BIO *bp,EC_KEY *x,int off,int ktype)

{
  int iVar1;
  point_conversion_form_t form;
  EC_GROUP *group;
  BIGNUM *num;
  EC_POINT *pEVar2;
  size_t len;
  char *pcVar3;
  char *pcVar4;
  uint8_t *pub;
  uint8_t *local_38;
  
  if ((x == (EC_KEY *)0x0) || (group = EC_KEY_get0_group((EC_KEY *)x), group == (EC_GROUP *)0x0)) {
    ERR_put_error(6,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/print.cc"
                  ,0xcf);
    return 0;
  }
  pcVar3 = "ECDSA-Parameters";
  if (ktype == 1) {
    pcVar3 = "Public-Key";
  }
  pcVar4 = "Private-Key";
  if (ktype != 2) {
    pcVar4 = pcVar3;
  }
  iVar1 = BIO_indent((BIO *)bp,off,0x80);
  if (iVar1 != 0) {
    iVar1 = EC_GROUP_get_curve_name(group);
    if (iVar1 != 0) {
      EC_curve_nid2nist(iVar1);
    }
    iVar1 = BIO_printf((BIO *)bp,"%s: (%s)\n",pcVar4);
    if (iVar1 < 1) {
      return 0;
    }
    if (((ktype == 2) && (num = EC_KEY_get0_private_key((EC_KEY *)x), num != (BIGNUM *)0x0)) &&
       (iVar1 = bn_print(bp,"priv:",(BIGNUM *)num,off), iVar1 == 0)) {
      return 0;
    }
    if ((ktype < 1) || (pEVar2 = EC_KEY_get0_public_key((EC_KEY *)x), pEVar2 == (EC_POINT *)0x0)) {
      return 1;
    }
    local_38 = (uint8_t *)0x0;
    form = EC_KEY_get_conv_form((EC_KEY *)x);
    len = EC_KEY_key2buf(x,form,&local_38,(BN_CTX *)0x0);
    if (len == 0) {
      return 0;
    }
    iVar1 = BIO_indent((BIO *)bp,off,0x80);
    if ((iVar1 == 0) || (iVar1 = BIO_puts((BIO *)bp,"pub:"), iVar1 < 1)) {
      OPENSSL_free(local_38);
    }
    else {
      iVar1 = print_hex(bp,local_38,len,off);
      OPENSSL_free(local_38);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int do_EC_KEY_print(BIO *bp, const EC_KEY *x, int off, int ktype) {
  const EC_GROUP *group;
  if (x == NULL || (group = EC_KEY_get0_group(x)) == NULL) {
    OPENSSL_PUT_ERROR(EVP, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  const char *ecstr;
  if (ktype == 2) {
    ecstr = "Private-Key";
  } else if (ktype == 1) {
    ecstr = "Public-Key";
  } else {
    ecstr = "ECDSA-Parameters";
  }

  if (!BIO_indent(bp, off, 128)) {
    return 0;
  }
  int curve_name = EC_GROUP_get_curve_name(group);
  if (BIO_printf(bp, "%s: (%s)\n", ecstr,
                 curve_name == NID_undef
                     ? "unknown curve"
                     : EC_curve_nid2nist(curve_name)) <= 0) {
    return 0;
  }

  if (ktype == 2) {
    const BIGNUM *priv_key = EC_KEY_get0_private_key(x);
    if (priv_key != NULL &&  //
        !bn_print(bp, "priv:", priv_key, off)) {
      return 0;
    }
  }

  if (ktype > 0 && EC_KEY_get0_public_key(x) != NULL) {
    uint8_t *pub = NULL;
    size_t pub_len = EC_KEY_key2buf(x, EC_KEY_get_conv_form(x), &pub, NULL);
    if (pub_len == 0) {
      return 0;
    }
    int ret = BIO_indent(bp, off, 128) &&  //
              BIO_puts(bp, "pub:") > 0 &&  //
              print_hex(bp, pub, pub_len, off);
    OPENSSL_free(pub);
    if (!ret) {
      return 0;
    }
  }

  return 1;
}